

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O3

ON_SubDEdgeSurfaceCurve * __thiscall
ON_SubDHeap::CopyEdgeSurfaceCurve
          (ON_SubDHeap *this,ON_SubDEdge *source_edge,ON_SubDEdge *desination_edge)

{
  byte bVar1;
  ON_SubDEdgeSurfaceCurve *pOVar2;
  bool bVar3;
  ON_SubDEdgeSurfaceCurve *limit_curve;
  
  if (desination_edge != (ON_SubDEdge *)0x0 && source_edge != desination_edge) {
    ON_SubDComponentBase::Internal_ClearSurfacePointFlag
              (&desination_edge->super_ON_SubDComponentBase);
    pOVar2 = desination_edge->m_limit_curve;
    if (source_edge->m_limit_curve == pOVar2) {
      desination_edge->m_limit_curve = (ON_SubDEdgeSurfaceCurve *)0x0;
    }
    else if (pOVar2 != (ON_SubDEdgeSurfaceCurve *)0x0) {
      pOVar2->m_cv_count = '\0';
    }
    bVar3 = ON_SubDComponentBase::Internal_SurfacePointFlag
                      (&source_edge->super_ON_SubDComponentBase);
    if (((!bVar3) || (pOVar2 = source_edge->m_limit_curve, pOVar2 == (ON_SubDEdgeSurfaceCurve *)0x0)
        ) || (bVar1 = pOVar2->m_cv_count, bVar1 == 0)) {
      ON_SubDComponentBase::Internal_ClearSurfacePointFlag(&source_edge->super_ON_SubDComponentBase)
      ;
      ReturnEdgeSurfaceCurve(this,desination_edge);
      return (ON_SubDEdgeSurfaceCurve *)0x0;
    }
    if ((0x13 < bVar1 || bVar1 == 1) || ((9 < bVar1 && (pOVar2->m_cvx == (double *)0x0)))) {
      ON_SubDComponentBase::Internal_ClearSurfacePointFlag(&source_edge->super_ON_SubDComponentBase)
      ;
      ReturnEdgeSurfaceCurve(this,desination_edge);
      goto LAB_006143d6;
    }
    limit_curve = desination_edge->m_limit_curve;
    if (limit_curve != (ON_SubDEdgeSurfaceCurve *)0x0) {
      if (bVar1 <= limit_curve->m_cv_capacity) goto LAB_006144df;
      ReturnEdgeSurfaceCurve(this,desination_edge);
    }
    limit_curve = AllocateEdgeSurfaceCurve(this,(uint)bVar1);
    if (limit_curve != (ON_SubDEdgeSurfaceCurve *)0x0) {
      if (bVar1 <= limit_curve->m_cv_capacity) {
LAB_006144df:
        memcpy(limit_curve->m_cv9,pOVar2->m_cv9,0xd8);
        if (((9 < bVar1) && (limit_curve->m_cvx != (double *)0x0)) &&
           (pOVar2->m_cvx != (double *)0x0)) {
          memcpy(limit_curve->m_cvx,pOVar2->m_cvx,(ulong)(bVar1 - 9) * 0x18);
        }
        limit_curve->m_cv_count = bVar1;
        desination_edge->m_limit_curve = limit_curve;
        ON_SubDComponentBase::Internal_SetSavedSurfacePointFlag
                  (&desination_edge->super_ON_SubDComponentBase,true);
        return limit_curve;
      }
      ReturnEdgeSurfaceCurve(this,limit_curve);
    }
  }
LAB_006143d6:
  ON_SubDIncrementErrorCount();
  return (ON_SubDEdgeSurfaceCurve *)0x0;
}

Assistant:

ON_SubDEdgeSurfaceCurve* ON_SubDHeap::CopyEdgeSurfaceCurve(const ON_SubDEdge* source_edge, const ON_SubDEdge* desination_edge)
{
  if ( nullptr == desination_edge || source_edge == desination_edge)
    return ON_SUBD_RETURN_ERROR(nullptr);

  desination_edge->Internal_ClearSurfacePointFlag();
  if (source_edge->m_limit_curve == desination_edge->m_limit_curve)
    desination_edge->m_limit_curve = nullptr;
  else if (nullptr != desination_edge->m_limit_curve)
    desination_edge->m_limit_curve->m_cv_count = 0;

  if (nullptr == source_edge)
  {
    ReturnEdgeSurfaceCurve(desination_edge);
    return ON_SUBD_RETURN_ERROR(nullptr);
  }

  const ON_SubDEdgeSurfaceCurve* source_curve = source_edge->Internal_SurfacePointFlag() ? source_edge->m_limit_curve : nullptr;
  const unsigned char cv_count = (nullptr != source_curve) ? source_curve->m_cv_count : 0;
  if (0 == cv_count)
  {
    source_edge->Internal_ClearSurfacePointFlag();
    ReturnEdgeSurfaceCurve(desination_edge);
    return nullptr;
  }

  if (cv_count < 2 || cv_count > ON_SubDEdgeSurfaceCurve::MaximumControlPointCapacity || (cv_count > ON_SubDEdgeSurfaceCurve::MinimumControlPointCapacity && nullptr == source_curve->m_cvx))
  {
    source_edge->Internal_ClearSurfacePointFlag();
    ReturnEdgeSurfaceCurve(desination_edge);
    return ON_SUBD_RETURN_ERROR(nullptr);
  }

  ON_SubDEdgeSurfaceCurve* desination_curve = desination_edge->m_limit_curve;
  if (nullptr != desination_curve && desination_curve->m_cv_capacity < cv_count)
  {
    ReturnEdgeSurfaceCurve(desination_edge);
    desination_curve = nullptr;
  }
  if (nullptr == desination_curve)
  {
    desination_curve = this->AllocateEdgeSurfaceCurve(cv_count);
    if (nullptr == desination_curve)
      return ON_SUBD_RETURN_ERROR(nullptr);
    if (desination_curve->m_cv_capacity < cv_count)
    {
      ReturnEdgeSurfaceCurve(desination_curve);
      return ON_SUBD_RETURN_ERROR(nullptr);
    }
  }
  const size_t sz9 = sizeof(desination_curve->m_cv9);
  memcpy(desination_curve->m_cv9, source_curve->m_cv9, sz9);
  if (cv_count > ON_SubDEdgeSurfaceCurve::MinimumControlPointCapacity && nullptr != desination_curve->m_cvx && nullptr != source_curve->m_cvx)
  {
    const size_t szx = ((size_t)(cv_count - ON_SubDEdgeSurfaceCurve::MinimumControlPointCapacity)) * 24;
    memcpy(desination_curve->m_cvx, source_curve->m_cvx, szx);
  }
  desination_curve->m_cv_count = cv_count;
  desination_edge->m_limit_curve = desination_curve;
  desination_edge->Internal_SetSavedSurfacePointFlag(true);
  return desination_curve;
}